

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

cmGeneratorTarget * __thiscall
cmLocalGenerator::FindGeneratorTargetToUse(cmLocalGenerator *this,string *name)

{
  bool bVar1;
  reference ppcVar2;
  cmGlobalGenerator *this_00;
  cmGeneratorTarget *t;
  NamedGeneratorTargetFinder local_58;
  __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  local_38;
  __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  local_30;
  __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  local_28;
  const_iterator imported;
  string *name_local;
  cmLocalGenerator *this_local;
  
  imported._M_current = (cmGeneratorTarget **)name;
  local_30._M_current =
       (cmGeneratorTarget **)
       std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin
                 (&this->ImportedGeneratorTargets);
  local_38._M_current =
       (cmGeneratorTarget **)
       std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end
                 (&this->ImportedGeneratorTargets);
  NamedGeneratorTargetFinder::NamedGeneratorTargetFinder(&local_58,(string *)imported._M_current);
  local_28 = std::
             find_if<__gnu_cxx::__normal_iterator<cmGeneratorTarget*const*,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,NamedGeneratorTargetFinder>
                       (local_30,local_38,&local_58);
  NamedGeneratorTargetFinder::~NamedGeneratorTargetFinder(&local_58);
  t = (cmGeneratorTarget *)
      std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end
                (&this->ImportedGeneratorTargets);
  bVar1 = __gnu_cxx::operator!=
                    (&local_28,
                     (__normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                      *)&t);
  if (bVar1) {
    ppcVar2 = __gnu_cxx::
              __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
              ::operator*(&local_28);
    this_local = (cmLocalGenerator *)*ppcVar2;
  }
  else {
    this_local = (cmLocalGenerator *)
                 FindLocalNonAliasGeneratorTarget(this,(string *)imported._M_current);
    if ((cmGeneratorTarget *)this_local == (cmGeneratorTarget *)0x0) {
      this_00 = GetGlobalGenerator(this);
      this_local = (cmLocalGenerator *)
                   cmGlobalGenerator::FindGeneratorTarget(this_00,(string *)imported._M_current);
    }
  }
  return (cmGeneratorTarget *)this_local;
}

Assistant:

cmGeneratorTarget* cmLocalGenerator::FindGeneratorTargetToUse(
  const std::string& name) const
{
  std::vector<cmGeneratorTarget*>::const_iterator imported = std::find_if(
    this->ImportedGeneratorTargets.begin(),
    this->ImportedGeneratorTargets.end(), NamedGeneratorTargetFinder(name));
  if (imported != this->ImportedGeneratorTargets.end()) {
    return *imported;
  }

  if (cmGeneratorTarget* t = this->FindLocalNonAliasGeneratorTarget(name)) {
    return t;
  }

  return this->GetGlobalGenerator()->FindGeneratorTarget(name);
}